

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentsHelper.cxx
# Opt level: O0

void __thiscall
cmCAString::cmCAString
          (cmCAString *this,cmCommandArgumentsHelper *args,char *key,cmCommandArgumentGroup *group)

{
  cmCommandArgumentGroup *group_local;
  char *key_local;
  cmCommandArgumentsHelper *args_local;
  cmCAString *this_local;
  
  cmCommandArgument::cmCommandArgument(&this->super_cmCommandArgument,args,key,group);
  (this->super_cmCommandArgument)._vptr_cmCommandArgument = (_func_int **)&PTR__cmCAString_00a50418;
  std::__cxx11::string::string((string *)&this->String);
  if ((key == (char *)0x0) || (*key == '\0')) {
    this->DataStart = 0;
  }
  else {
    this->DataStart = 1;
  }
  return;
}

Assistant:

cmCAString::cmCAString(cmCommandArgumentsHelper* args,
                       const char* key,
                       cmCommandArgumentGroup* group)
:cmCommandArgument(args, key, group)
{
  if ((key==0) || (*key==0))
    {
    this->DataStart = 0;
    }
  else
    {
    this->DataStart = 1;
    }
}